

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O3

void __thiscall
Iir::LowPassTransform::LowPassTransform
          (LowPassTransform *this,double fc,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  double dVar2;
  PoleZeroPair *pPVar3;
  invalid_argument *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint pairIndex;
  ulong uVar4;
  int pairIndex_00;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  complex_t cVar8;
  complex_t local_50;
  complex_t local_40;
  
  this->f = 0.0;
  if (0.5 <= fc) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"The cutoff frequency needs to be below the Nyquist frequency.");
  }
  else {
    if (0.0 <= fc) {
      digital->m_numPoles = 0;
      dVar2 = tan(fc * 3.141592653589793);
      this->f = dVar2;
      uVar1 = analog->m_numPoles;
      pairIndex = (int)uVar1 / 2;
      if (1 < (int)uVar1) {
        uVar4 = 0;
        do {
          pairIndex_00 = (int)uVar4;
          pPVar3 = LayoutBase::getPair(analog,pairIndex_00);
          uVar6 = *(undefined8 *)((pPVar3->poles).super_complex_pair_t.first._M_value + 8);
          cVar8._M_value._8_8_ = extraout_RDX;
          cVar8._M_value._0_8_ = uVar4;
          cVar8 = transform(this,cVar8);
          c._M_value._8_8_ = cVar8._M_value._8_8_;
          uVar7 = *(undefined8 *)((pPVar3->zeros).super_complex_pair_t.first._M_value + 8);
          c._M_value._0_8_ = uVar4;
          local_40._M_value._8_8_ = uVar6;
          transform(this,c);
          local_50._M_value._8_8_ = uVar7;
          LayoutBase::addPoleZeroConjugatePairs(digital,&local_40,&local_50);
          uVar5 = pairIndex_00 + 1;
          uVar4 = (ulong)uVar5;
        } while (pairIndex != uVar5);
      }
      if ((uVar1 & 1) != 0) {
        uVar4 = (ulong)pairIndex;
        pPVar3 = LayoutBase::getPair(analog,pairIndex);
        uVar6 = *(undefined8 *)((pPVar3->poles).super_complex_pair_t.first._M_value + 8);
        c_00._M_value._8_8_ = extraout_RDX_00;
        c_00._M_value._0_8_ = uVar4;
        cVar8 = transform(this,c_00);
        c_01._M_value._8_8_ = cVar8._M_value._8_8_;
        uVar7 = *(undefined8 *)((pPVar3->zeros).super_complex_pair_t.first._M_value + 8);
        c_01._M_value._0_8_ = uVar4;
        local_40._M_value._8_8_ = uVar6;
        transform(this,c_01);
        local_50._M_value._8_8_ = uVar7;
        LayoutBase::add(digital,&local_40,&local_50);
      }
      dVar2 = analog->m_normalGain;
      digital->m_normalW = analog->m_normalW;
      digital->m_normalGain = dVar2;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Cutoff frequency is negative.");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

LowPassTransform::LowPassTransform (double fc,
                                    LayoutBase& digital,
                                    LayoutBase const& analog)
{

	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);
	
	digital.reset ();

	// prewarp
	f = tan (doublePi * fc);
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		digital.addPoleZeroConjugatePairs (transform (pair.poles.first),
						   transform (pair.zeros.first));
	}
	
	if (numPoles & 1)
	{
		const PoleZeroPair& pair = analog[pairs];
		digital.add (transform (pair.poles.first),
			     transform (pair.zeros.first));
	}
	
	digital.setNormal (analog.getNormalW(),
			   analog.getNormalGain());
}